

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

void __thiscall sjtu::LRUCache<sjtu::trainType>::~LRUCache(LRUCache<sjtu::trainType> *this)

{
  ostream *poVar1;
  CacheNode *this_00;
  
  this_00 = this->head;
  while (this_00 != (CacheNode *)0x0) {
    this->tail = this_00->succ;
    CacheNode::~CacheNode(this_00);
    operator_delete(this_00,0xa7d0);
    this_00 = this->tail;
    this->head = this_00;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Attempt count: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Miss count: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Miss rate: ",0xb);
  poVar1 = std::ostream::_M_insert<long_double>
                     (((longdouble)this->miss_count * (longdouble)100.0) /
                      (longdouble)this->attempt_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::~map(&this->table);
  return;
}

Assistant:

~LRUCache()
		{
			for (;head;head = tail) tail = head -> succ , delete head;
			std::cerr << "Attempt count: " << attempt_count << std::endl;
			std::cerr << "Miss count: " << miss_count << std::endl;
			std::cerr << "Miss rate: " << static_cast<long double> (miss_count) / attempt_count * 100 << "%" << std::endl;
		}